

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O0

CharMapper<bool> * gmlc::utilities::numericEndMapper(void)

{
  CharMapper<bool> *in_RDI;
  CharMapper<bool> *mapper;
  undefined1 in_stack_ffffffffffffffee;
  uchar in_stack_ffffffffffffffef;
  CharMapper<bool> *this;
  
  this = in_RDI;
  CharMapper<bool>::CharMapper(in_RDI,(bool)in_stack_ffffffffffffffef);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  CharMapper<bool>::addKey(this,in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  return in_RDI;
}

Assistant:

CharMapper<bool> numericEndMapper()
{
    CharMapper<bool> mapper(false);
    mapper.addKey('0', true);
    mapper.addKey('1', true);
    mapper.addKey('2', true);
    mapper.addKey('3', true);
    mapper.addKey('4', true);
    mapper.addKey('5', true);
    mapper.addKey('6', true);
    mapper.addKey('7', true);
    mapper.addKey('8', true);
    mapper.addKey('9', true);
    mapper.addKey(' ', true);
    mapper.addKey('\t', true);
    mapper.addKey('\n', true);
    mapper.addKey('\r', true);
    mapper.addKey('\0', true);
    return mapper;
}